

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::SetDefaultPayloadType(RTPSession *this,uint8_t pt)

{
  int iVar1;
  
  if (this->created == true) {
    if ((this->packetbuilder).init == true) {
      (this->packetbuilder).defptset = true;
      (this->packetbuilder).defaultpayloadtype = pt;
      return 0;
    }
    iVar1 = -0x14;
  }
  else {
    iVar1 = -0x3e;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetDefaultPayloadType(uint8_t pt)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;
	
	int status;
	
	BUILDER_LOCK
	status = packetbuilder.SetDefaultPayloadType(pt);
	BUILDER_UNLOCK
	return status;
}